

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O1

sha1 * __thiscall pstore::http::sha1::input(sha1 *this,span<const_unsigned_char,__1L> *span)

{
  ulong uVar1;
  uint uVar2;
  reference ptVar3;
  iterator __begin2;
  iterator __end2;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_40;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_30;
  
  if ((((span->storage_).data_ != (pointer)0x0) && (this->computed_ == false)) &&
     (this->corrupted_ == false)) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    span_iterator(&local_40,span,0);
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    span_iterator(&local_30,span,(span->storage_).super_extent_type<_1L>.size_);
    if ((local_40.span_ != local_30.span_) || (local_40.index_ != local_30.index_)) {
      do {
        ptVar3 = pstore::gsl::details::
                 span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::operator*
                           (&local_40);
        uVar2 = this->index_;
        (this->message_block_)._M_elems[uVar2] = *ptVar3;
        uVar2 = uVar2 + 1;
        this->index_ = uVar2;
        uVar1 = this->length_;
        this->length_ = uVar1 + 8;
        if (uVar1 < 0xfffffffffffffff8) {
          if (uVar2 == 0x40) {
            process_message_block(this);
          }
        }
        else {
          this->corrupted_ = true;
        }
        if (0xfffffffffffffff7 < uVar1) {
          return this;
        }
        pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
        operator++(&local_40);
      } while ((local_40.span_ != local_30.span_) || (local_40.index_ != local_30.index_));
    }
  }
  return this;
}

Assistant:

sha1 & sha1::input (gsl::span<std::uint8_t const> const & span) noexcept {
            if (span.data () == nullptr || computed_ || corrupted_) {
                return *this;
            }

            for (std::uint8_t const b : span) {
                message_block_[index_] = b;
                ++index_;

                auto const old_length = length_;
                length_ += 8;
                if (length_ < old_length) { // Detect overflow.
                    corrupted_ = true;      // Message is too long.
                    break;
                }

                if (index_ == 64) {
                    this->process_message_block ();
                }
            }
            return *this;
        }